

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  PyTypeObject *op;
  int __val;
  long lVar1;
  PyObject *pPVar2;
  PyTypeObject *pPVar3;
  string *in_RDI;
  error_scope scope;
  error_scope local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [24];
  object local_130;
  PyTypeObject *local_128;
  handle local_120;
  handle local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Unknown internal error occurred",(allocator<char> *)&local_168);
  }
  else {
    error_scope::error_scope(&local_180);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (local_180.type != (PyObject *)0x0) {
      local_148._8_8_ = local_180.type;
      local_148._16_8_ = "__name__";
      local_130.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                (&local_168,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_148);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_168);
      object::~object(&local_130);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_180.value != (PyObject *)0x0) {
      str::str((str *)local_148,(handle)local_180.value);
      str::operator_cast_to_string(&local_168,(str *)local_148);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_168);
      object::~object((object *)local_148);
    }
    PyErr_NormalizeException(&local_180,&local_180.value,&local_180.trace);
    if (local_180.trace != (PyObject *)0x0) {
      PyException_SetTraceback(local_180.value);
      if (local_180.trace != (PyObject *)0x0) {
        do {
          pPVar2 = local_180.trace;
          local_180.trace = (PyObject *)pPVar2[1].ob_refcnt;
        } while (local_180.trace != (PyObject *)0x0);
        pPVar3 = pPVar2[1].ob_type;
        if (pPVar3 != (PyTypeObject *)0x0) {
          (pPVar3->ob_base).ob_base.ob_refcnt = (pPVar3->ob_base).ob_base.ob_refcnt + 1;
        }
        std::__cxx11::string::append((char *)in_RDI);
        while (pPVar3 != (PyTypeObject *)0x0) {
          pPVar2 = (PyObject *)PyFrame_GetCode(pPVar3);
          local_128 = pPVar3;
          __val = PyFrame_GetLineNumber(pPVar3);
          local_118.m_ptr = (PyObject *)pPVar2[6].ob_type;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_90,&local_118);
          std::operator+(&local_70,"  ",&local_90);
          std::operator+(&local_110,&local_70,"(");
          std::__cxx11::to_string(&local_b0,__val);
          std::operator+(&local_50,&local_110,&local_b0);
          std::operator+(&local_f0,&local_50,"): ");
          local_120.m_ptr = (PyObject *)pPVar2[7].ob_refcnt;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_d0,&local_120);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,&local_f0,&local_d0);
          std::operator+(&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,"\n");
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)local_148);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          _Py_DECREF(pPVar2);
          op = local_128;
          pPVar3 = (PyTypeObject *)PyFrame_GetBack(local_128);
          _Py_DECREF((PyObject *)op);
        }
      }
    }
    error_scope::~error_scope(&local_180);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value) {
        errorString += (std::string) str(scope.value);
    }

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr) {
        PyException_SetTraceback(scope.value, scope.trace);
    }
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        auto *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next) {
            trace = trace->tb_next;
        }

        PyFrameObject *frame = trace->tb_frame;
        Py_XINCREF(frame);
        errorString += "\n\nAt:\n";
        while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
            PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
            PyCodeObject *f_code = frame->f_code;
            Py_INCREF(f_code);
#    endif
            int lineno = PyFrame_GetLineNumber(frame);
            errorString += "  " + handle(f_code->co_filename).cast<std::string>() + "("
                           + std::to_string(lineno)
                           + "): " + handle(f_code->co_name).cast<std::string>() + "\n";
            Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
            auto *b_frame = PyFrame_GetBack(frame);
#    else
            auto *b_frame = frame->f_back;
            Py_XINCREF(b_frame);
#    endif
            Py_DECREF(frame);
            frame = b_frame;
        }
    }
#endif

    return errorString;
}